

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O1

void __thiscall
llvm::detail::DoubleAPFloat::DoubleAPFloat(DoubleAPFloat *this,fltSemantics *S,integerPart I)

{
  undefined8 *puVar1;
  
  this->Semantics = S;
  puVar1 = (undefined8 *)operator_new__(0x48);
  *puVar1 = 2;
  IEEEFloat::IEEEFloat((IEEEFloat *)(puVar1 + 2),(fltSemantics *)semIEEEdouble,I);
  IEEEFloat::IEEEFloat((IEEEFloat *)(puVar1 + 6),(fltSemantics *)semIEEEdouble);
  (this->Floats)._M_t.super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>.
  _M_t.super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
  super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl = (APFloat *)(puVar1 + 1);
  if (this->Semantics == (fltSemantics *)semPPCDoubleDouble) {
    return;
  }
  __assert_fail("Semantics == &semPPCDoubleDouble",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                ,0xf19,
                "llvm::detail::DoubleAPFloat::DoubleAPFloat(const fltSemantics &, integerPart)");
}

Assistant:

DoubleAPFloat::DoubleAPFloat(const fltSemantics &S, integerPart I)
    : Semantics(&S), Floats(new APFloat[2]{APFloat(semIEEEdouble, I),
                                           APFloat(semIEEEdouble)}) {
  assert(Semantics == &semPPCDoubleDouble);
}